

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfEnvmap.cpp
# Opt level: O0

V3f Imf_3_2::CubeMap::direction(CubeMapFace face,Box2i *dataWindow,V2f *positionInFace)

{
  float *in_RCX;
  undefined4 in_ESI;
  Box2i *in_RDI;
  float fVar1;
  ulong extraout_XMM0_Qa;
  ulong uVar2;
  float fVar3;
  V3f VVar4;
  V2f pos;
  int sof;
  V3f *dir;
  Vec2<float> local_3c;
  Vec2<float> local_34;
  Vec2<float> local_2c;
  int local_24;
  float *local_20;
  undefined4 local_c;
  
  local_20 = in_RCX;
  local_c = in_ESI;
  local_24 = sizeOfFace(in_RDI);
  Imath_3_2::Vec2<float>::Vec2(&local_2c);
  if (local_24 < 2) {
    Imath_3_2::Vec2<float>::Vec2(&local_3c,0.0,0.0);
    Imath_3_2::Vec2<float>::operator=(&local_2c,&local_3c);
  }
  else {
    fVar1 = *local_20 / (float)(local_24 + -1);
    fVar3 = local_20[1] / (float)(local_24 + -1);
    Imath_3_2::Vec2<float>::Vec2(&local_34,fVar1 + fVar1 + -1.0,fVar3 + fVar3 + -1.0);
    Imath_3_2::Vec2<float>::operator=(&local_2c,&local_34);
  }
  fVar1 = 0.0;
  Imath_3_2::Vec3<float>::Vec3((Vec3<float> *)in_RDI,1.0,0.0,0.0);
  uVar2 = extraout_XMM0_Qa;
  switch(local_c) {
  case 0:
    (in_RDI->min).x = 0x3f800000;
    (in_RDI->min).y = (int)local_2c.x;
    uVar2 = (ulong)(uint)local_2c.y;
    (in_RDI->max).x = (int)local_2c.y;
    break;
  case 1:
    (in_RDI->min).x = -0x40800000;
    (in_RDI->min).y = (int)local_2c.x;
    uVar2 = (ulong)(uint)local_2c.y;
    (in_RDI->max).x = (int)local_2c.y;
    break;
  case 2:
    (in_RDI->min).x = (int)local_2c.x;
    (in_RDI->min).y = 0x3f800000;
    uVar2 = (ulong)(uint)local_2c.y;
    (in_RDI->max).x = (int)local_2c.y;
    break;
  case 3:
    (in_RDI->min).x = (int)local_2c.x;
    (in_RDI->min).y = -0x40800000;
    uVar2 = (ulong)(uint)local_2c.y;
    (in_RDI->max).x = (int)local_2c.y;
    break;
  case 4:
    (in_RDI->min).x = (int)local_2c.x;
    (in_RDI->min).y = (int)local_2c.y;
    uVar2 = 0x3f800000;
    (in_RDI->max).x = 0x3f800000;
    break;
  case 5:
    (in_RDI->min).x = (int)local_2c.x;
    (in_RDI->min).y = (int)local_2c.y;
    uVar2 = 0xbf800000;
    (in_RDI->max).x = -0x40800000;
  }
  VVar4.z = fVar1;
  VVar4.x = (float)(int)uVar2;
  VVar4.y = (float)(int)(uVar2 >> 0x20);
  return VVar4;
}

Assistant:

V3f
direction (CubeMapFace face, const Box2i& dataWindow, const V2f& positionInFace)
{
    int sof = sizeOfFace (dataWindow);

    V2f pos;

    if (sof > 1)
    {
        pos = V2f (
            positionInFace.x / (sof - 1) * 2 - 1,
            positionInFace.y / (sof - 1) * 2 - 1);
    }
    else
    {
        pos = V2f (0, 0);
    }

    V3f dir (1, 0, 0);

    switch (face)
    {
        case CUBEFACE_POS_X:

            dir.x = 1;
            dir.y = pos.x;
            dir.z = pos.y;
            break;

        case CUBEFACE_NEG_X:

            dir.x = -1;
            dir.y = pos.x;
            dir.z = pos.y;
            break;

        case CUBEFACE_POS_Y:

            dir.x = pos.x;
            dir.y = 1;
            dir.z = pos.y;
            break;

        case CUBEFACE_NEG_Y:

            dir.x = pos.x;
            dir.y = -1;
            dir.z = pos.y;
            break;

        case CUBEFACE_POS_Z:

            dir.x = pos.x;
            dir.y = pos.y;
            dir.z = 1;
            break;

        case CUBEFACE_NEG_Z:

            dir.x = pos.x;
            dir.y = pos.y;
            dir.z = -1;
            break;
    }

    return dir;
}